

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programStreamDemuxer.cpp
# Opt level: O1

int64_t getPSDuration(char *fileName)

{
  byte bVar1;
  bool bVar2;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  int64_t iVar6;
  size_t __nbytes;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  int bufferSize;
  int64_t fileSize;
  File file;
  int64_t local_60;
  File local_58;
  
  __nbytes = 0;
  File::File(&local_58,fileName,1,0);
  bVar2 = File::size(&local_58,&local_60);
  if (bVar2) {
    pvVar3 = operator_new__(0x40000);
    uVar4 = File::read(&local_58,(int)pvVar3,(void *)0x40000,__nbytes);
    if (0 < (int)(uint)uVar4) {
      pbVar7 = (byte *)((uVar4 & 0xffffffff) + (long)pvVar3);
      pbVar9 = pbVar7;
      if (2 < (uint)uVar4) {
        pbVar8 = (byte *)((long)pvVar3 + 2);
        do {
          lVar5 = 3;
          if (*pbVar8 < 2) {
            if (*pbVar8 == 0) {
              lVar5 = 1;
            }
            else if ((pbVar8[-2] == 0) && (pbVar8[-1] == 0)) {
              pbVar9 = pbVar8 + -2;
              break;
            }
          }
          pbVar8 = pbVar8 + lVar5;
        } while (pbVar8 < pbVar7);
      }
      uVar4 = 0;
      do {
        if (pbVar7 + -9 < pbVar9) break;
        if (((byte)(pbVar9[3] + 0x41) < 0x31 || (pbVar9[3] & 0xbf) == 0xbd) &&
           ((char)pbVar9[7] < '\0')) {
          uVar4 = (ulong)((ushort)(*(ushort *)(pbVar9 + 0xc) << 8 | *(ushort *)(pbVar9 + 0xc) >> 8)
                         >> 1) |
                  (ulong)((pbVar9[0xb] & 0xfe) << 0xe | (uint)pbVar9[10] << 0x16) |
                  (ulong)(pbVar9[9] >> 1 & 7) << 0x1e;
          bVar2 = false;
        }
        else {
          bVar2 = true;
          for (pbVar8 = pbVar9 + 6; pbVar9 = pbVar7, pbVar8 < pbVar7; pbVar8 = pbVar8 + lVar5) {
            lVar5 = 3;
            if (*pbVar8 < 2) {
              if (*pbVar8 == 0) {
                lVar5 = 1;
              }
              else if ((pbVar8[-2] == 0) && (pbVar8[-1] == 0)) {
                pbVar9 = pbVar8 + -2;
                break;
              }
            }
          }
        }
      } while (bVar2);
      operator_delete__(pvVar3);
      bufferSize = 0x40000;
      bVar1 = 1;
      do {
        iVar6 = getLastPCR(&local_58,bufferSize,local_60);
        bufferSize = 0x100000;
        bVar2 = (bool)(bVar1 & iVar6 == -1);
        bVar1 = 0;
      } while (bVar2);
      File::close(&local_58,0x100000);
      lVar5 = 0;
      if (-1 < iVar6) {
        lVar5 = iVar6 - uVar4;
      }
      goto LAB_001c9222;
    }
    operator_delete__(pvVar3);
  }
  lVar5 = 0;
LAB_001c9222:
  File::~File(&local_58);
  return lVar5;
}

Assistant:

int64_t getPSDuration(const char* fileName)
{
    constexpr int BUF_SIZE = 1024 * 256;

    try
    {
        int64_t fileSize;
        File file(fileName, File::ofRead);
        if (!file.size(&fileSize))
            return 0;

        const auto tmpBuffer = new uint8_t[BUF_SIZE];

        // pcr from start of file
        const int len = file.read(tmpBuffer, BUF_SIZE);
        if (len < 1)
        {
            delete[] tmpBuffer;
            return 0;
        }
        uint8_t* curPtr = tmpBuffer;
        int64_t firstPcrVal = 0;
        uint8_t* bufEnd = tmpBuffer + len;
        curPtr = MPEGHeader::findNextMarker(curPtr, bufEnd);
        while (curPtr <= bufEnd - 9)
        {
            const auto pesPacket = reinterpret_cast<PESPacket*>(curPtr);
            const uint8_t startcode = curPtr[3];
            if ((startcode >= 0xc0 && startcode <= 0xef) || (startcode == PES_PRIVATE_DATA1) ||
                (startcode == PES_VC1_ID) || (startcode == PES_PRIVATE_DATA2))
            {
                if ((pesPacket->flagsLo & 0x80) == 0x80)
                {
                    firstPcrVal = pesPacket->getPts();
                    break;
                }
            }
            curPtr = MPEGHeader::findNextMarker(curPtr + 4, bufEnd);
        }
        delete[] tmpBuffer;

        // pcr from end of file

        int64_t lastPcrVal;
        int bufferSize = BUF_SIZE;
        do
        {
            lastPcrVal = getLastPCR(file, bufferSize, fileSize);
            bufferSize *= 4;
        } while (lastPcrVal == -1 && bufferSize <= 1024 * 1024);

        file.close();

        return lastPcrVal >= 0 ? lastPcrVal - firstPcrVal : 0;
    }
    catch (...)
    {
        return 0;
    }
}